

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# training.cc
# Opt level: O1

void __thiscall dynet::Trainer::update(Trainer *this)

{
  LookupParameterStorage *pLVar1;
  ParameterCollectionStorage *pPVar2;
  pointer ppPVar3;
  pointer ppLVar4;
  _Hash_node_base *p_Var5;
  ulong uVar6;
  float fVar7;
  
  if (this->aux_allocated == false) {
    (*this->_vptr_Trainer[4])(this);
    this->aux_allocated = true;
  }
  fVar7 = clip_gradients(this);
  pPVar2 = ParameterCollection::get_storage(this->model);
  ppPVar3 = (pPVar2->params).
            super__Vector_base<dynet::ParameterStorage_*,_std::allocator<dynet::ParameterStorage_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((pPVar2->params).
      super__Vector_base<dynet::ParameterStorage_*,_std::allocator<dynet::ParameterStorage_*>_>.
      _M_impl.super__Vector_impl_data._M_finish != ppPVar3) {
    uVar6 = 0;
    do {
      if (ppPVar3[uVar6]->updated == true) {
        (*this->_vptr_Trainer[6])(fVar7,this,uVar6);
        ParameterStorage::clear
                  ((pPVar2->params).
                   super__Vector_base<dynet::ParameterStorage_*,_std::allocator<dynet::ParameterStorage_*>_>
                   ._M_impl.super__Vector_impl_data._M_start[uVar6]);
      }
      uVar6 = uVar6 + 1;
      ppPVar3 = (pPVar2->params).
                super__Vector_base<dynet::ParameterStorage_*,_std::allocator<dynet::ParameterStorage_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
    } while (uVar6 < (ulong)((long)(pPVar2->params).
                                   super__Vector_base<dynet::ParameterStorage_*,_std::allocator<dynet::ParameterStorage_*>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)ppPVar3 >> 3))
    ;
  }
  pPVar2 = ParameterCollection::get_storage(this->model);
  ppLVar4 = (pPVar2->lookup_params).
            super__Vector_base<dynet::LookupParameterStorage_*,_std::allocator<dynet::LookupParameterStorage_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((pPVar2->lookup_params).
      super__Vector_base<dynet::LookupParameterStorage_*,_std::allocator<dynet::LookupParameterStorage_*>_>
      ._M_impl.super__Vector_impl_data._M_finish != ppLVar4) {
    uVar6 = 0;
    do {
      if (((this->sparse_updates_enabled == true) &&
          (pLVar1 = ppLVar4[uVar6], pLVar1->updated == true)) && (pLVar1->all_updated == false)) {
        for (p_Var5 = (pLVar1->non_zero_grads)._M_h._M_before_begin._M_nxt;
            p_Var5 != (_Hash_node_base *)0x0; p_Var5 = p_Var5->_M_nxt) {
          (*this->_vptr_Trainer[7])(fVar7,this,uVar6,(ulong)*(uint *)&p_Var5[1]._M_nxt);
        }
      }
      else {
        (*this->_vptr_Trainer[8])(fVar7,this,uVar6);
      }
      LookupParameterStorage::clear(ppLVar4[uVar6]);
      uVar6 = uVar6 + 1;
      ppLVar4 = (pPVar2->lookup_params).
                super__Vector_base<dynet::LookupParameterStorage_*,_std::allocator<dynet::LookupParameterStorage_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
    } while (uVar6 < (ulong)((long)(pPVar2->lookup_params).
                                   super__Vector_base<dynet::LookupParameterStorage_*,_std::allocator<dynet::LookupParameterStorage_*>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)ppLVar4 >> 3))
    ;
  }
  this->updates = this->updates + 1.0;
  this->updates_since_status = this->updates_since_status + 1.0;
  pPVar2 = ParameterCollection::get_storage(this->model);
  fVar7 = (pPVar2->weight_decay).weight_decay;
  fVar7 = fVar7 - (pPVar2->weight_decay).lambda * fVar7;
  (pPVar2->weight_decay).weight_decay = fVar7;
  if (0.25 <= fVar7) {
    return;
  }
  rescale_and_reset_weight_decay(this);
  return;
}

Assistant:

void Trainer::update() {
  // Allocate if necessary
  if(!aux_allocated) {
    alloc_impl();
    aux_allocated = true;
  }

  // Perform gradient clipping and cycle through parameters
  const float gscale = clip_gradients();
  const auto & params = model->parameters_list();
  for(size_t i = 0; i < params.size(); ++i) {
    if(params[i]->updated) {
      update_params(gscale, i);
      params[i]->clear();
    }
  }
  const auto & lparams = model->lookup_parameters_list();
  for(size_t i = 0; i < lparams.size(); ++i) {
    auto &p = lparams[i];
    if(sparse_updates_enabled && p->updated && !p->all_updated) {
      for (auto j : p->non_zero_grads)
        update_lookup_params(gscale, i, j);
    } else {
      update_lookup_params(gscale, i);
    }
    p->clear();
  }
  ++updates;
  ++updates_since_status;

  L2WeightDecay & wd = model->get_weight_decay();
  wd.update_weight_decay(); // update global weight scale
  if (wd.parameters_need_rescaled())
    rescale_and_reset_weight_decay();  // if wdscale is getting to small multiply all weights by wdscale, and set wdscale to 1
}